

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

char * Strsafe_find(char *key)

{
  int iVar1;
  char cVar2;
  char *pcVar3;
  uint uVar4;
  s_x1node *psVar5;
  
  uVar4 = 0;
  if (x1a != (s_x1 *)0x0) {
    cVar2 = *key;
    if (cVar2 != '\0') {
      pcVar3 = key + 1;
      uVar4 = 0;
      do {
        uVar4 = (int)cVar2 + uVar4 * 0xd;
        cVar2 = *pcVar3;
        pcVar3 = pcVar3 + 1;
      } while (cVar2 != '\0');
    }
    for (psVar5 = x1a->ht[x1a->size - 1U & uVar4]; psVar5 != (s_x1node *)0x0; psVar5 = psVar5->next)
    {
      pcVar3 = psVar5->data;
      iVar1 = strcmp(pcVar3,key);
      if (iVar1 == 0) {
        return pcVar3;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

const char *Strsafe_find(const char *key)
{
  unsigned h;
  x1node *np;

  if( x1a==0 ) return 0;
  h = strhash(key) & (x1a->size-1);
  np = x1a->ht[h];
  while( np ){
    if( strcmp(np->data,key)==0 ) break;
    np = np->next;
  }
  return np ? np->data : 0;
}